

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

void join(string *result,string *separator,vector<int,_std::allocator<int>_> *items)

{
  ulong uVar1;
  ulong uVar2;
  stringstream s;
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar1 = (ulong)((long)(items->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(items->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  for (uVar2 = 0; (uVar1 & 0xffffffff) != uVar2; uVar2 = uVar2 + 1) {
    std::ostream::operator<<
              (local_1a8,
               (items->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar2]);
    if (uVar2 < (int)uVar1 - 1) {
      std::operator<<(local_1a8,(string *)separator);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)result,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void join (
  std::string& result,
  const std::string& separator,
  const std::vector<int>& items)
{
  std::stringstream s;
  unsigned int size = items.size ();
  for (unsigned int i = 0; i < size; ++i)
  {
    s << items[i];
    if (i < size - 1)
      s << separator;
  }

  result = s.str ();
}